

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer_allocator.cpp
# Opt level: O2

torrent_peer * __thiscall
libtorrent::aux::torrent_peer_allocator::allocate_peer_entry(torrent_peer_allocator *this,int type)

{
  undefined4 uVar1;
  undefined4 uVar2;
  torrent_peer *ptVar3;
  long lVar4;
  int iVar5;
  undefined4 in_register_00000034;
  size_t __size;
  long lVar6;
  long lVar7;
  
  __size = CONCAT44(in_register_00000034,type);
  if (type == 2) {
    ptVar3 = (torrent_peer *)
             boost::pool<libtorrent::aux::allocator_new_delete>::malloc
                       (&this->m_i2p_peer_pool,__size);
    if (ptVar3 != (torrent_peer *)0x0) {
      iVar5 = 0x28;
      lVar4 = 0x28;
      lVar6 = 0x98;
      lVar7 = 0xa0;
      goto LAB_00321750;
    }
  }
  else if (type == 1) {
    ptVar3 = (torrent_peer *)
             boost::pool<libtorrent::aux::allocator_new_delete>::malloc
                       (&this->m_ipv6_peer_pool,__size);
    if (ptVar3 != (torrent_peer *)0x0) {
      iVar5 = 0x30;
      lVar4 = 0x30;
      lVar6 = 0x60;
      lVar7 = 0x68;
      goto LAB_00321750;
    }
  }
  else if ((type == 0) &&
          (ptVar3 = (torrent_peer *)
                    boost::pool<libtorrent::aux::allocator_new_delete>::malloc
                              (&this->m_ipv4_peer_pool,__size), ptVar3 != (torrent_peer *)0x0)) {
    iVar5 = 0x28;
    lVar4 = 0x28;
    lVar7 = 0x30;
    lVar6 = lVar4;
LAB_00321750:
    *(undefined8 *)
     ((long)&(this->super_torrent_peer_allocator_interface)._vptr_torrent_peer_allocator_interface +
     lVar7) = 500;
    *(undefined8 *)
     ((long)&(this->super_torrent_peer_allocator_interface)._vptr_torrent_peer_allocator_interface +
     lVar6) = 500;
    uVar1 = this->m_live_bytes;
    uVar2 = this->m_live_allocations;
    this->m_live_bytes = iVar5 + uVar1;
    this->m_live_allocations = uVar2 + 1;
    this->m_total_bytes = lVar4 + this->m_total_bytes;
    this->m_total_allocations = this->m_total_allocations + 1;
    return ptVar3;
  }
  return (torrent_peer *)0x0;
}

Assistant:

torrent_peer* torrent_peer_allocator::allocate_peer_entry(int type)
	{
		TORRENT_ASSERT(m_in_use);
		torrent_peer* p = nullptr;
		switch(type)
		{
			case torrent_peer_allocator_interface::ipv4_peer_type:
				p = static_cast<torrent_peer*>(m_ipv4_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_ipv4_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(ipv4_peer);
				m_live_bytes += sizeof(ipv4_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
			case torrent_peer_allocator_interface::ipv6_peer_type:
				p = static_cast<torrent_peer*>(m_ipv6_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_ipv6_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(ipv6_peer);
				m_live_bytes += sizeof(ipv6_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
#if TORRENT_USE_I2P
			case torrent_peer_allocator_interface::i2p_peer_type:
				p = static_cast<torrent_peer*>(m_i2p_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_i2p_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(i2p_peer);
				m_live_bytes += sizeof(i2p_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
#endif
#if TORRENT_USE_RTC
            case torrent_peer_allocator_interface::rtc_peer_type:
                p = static_cast<torrent_peer*>(m_rtc_peer_pool.malloc());
                if (p == nullptr) return nullptr;
                m_rtc_peer_pool.set_next_size(500);
                m_total_bytes += sizeof(rtc_peer);
                m_live_bytes += sizeof(rtc_peer);
                ++m_live_allocations;
                ++m_total_allocations;
                break;
#endif
		}
		return p;
	}